

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O0

Error __thiscall
asmjit::CodeCompiler::_newReg
          (CodeCompiler *this,Reg *out,uint32_t typeId,char *nameFmt,__va_list_tag *ap)

{
  Error EVar1;
  uint32_t typeId_00;
  StringBuilderTmp<256UL> sb;
  __va_list_tag *in_stack_00000268;
  char *in_stack_00000270;
  uint32_t in_stack_0000027c;
  StringBuilder *in_stack_00000280;
  char *in_stack_fffffffffffffe70;
  undefined1 local_188 [4];
  Reg *out_00;
  CodeCompiler *this_00;
  undefined1 local_168 [304];
  undefined1 *local_38;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_10 = &NoInit;
  typeId_00 = (uint32_t)((ulong)local_168 >> 0x20);
  local_168[0] = 0;
  out_00 = (Reg *)0x0;
  this_00 = (CodeCompiler *)0x100;
  local_38 = local_188;
  local_20 = local_188;
  local_8 = local_188;
  StringBuilder::_opVFormat(in_stack_00000280,in_stack_0000027c,in_stack_00000270,in_stack_00000268)
  ;
  local_18 = local_188;
  EVar1 = _newReg(this_00,out_00,typeId_00,in_stack_fffffffffffffe70);
  StringBuilderTmp<256UL>::~StringBuilderTmp((StringBuilderTmp<256UL> *)0x11406d);
  return EVar1;
}

Assistant:

Error CodeCompiler::_newReg(Reg& out, uint32_t typeId, const char* nameFmt, va_list ap) {
  StringBuilderTmp<256> sb;
  sb.appendFormatVA(nameFmt, ap);
  return _newReg(out, typeId, sb.getData());
}